

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

QStringList * __thiscall QInputDialog::comboBoxItems(QInputDialog *this)

{
  long lVar1;
  int iVar2;
  QInputDialogPrivate *pQVar3;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  int i;
  int count;
  QInputDialogPrivate *d;
  QStringList *result;
  QStringList *this_00;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  QStringList *this_01;
  int in_stack_ffffffffffffffe4;
  QComboBox *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RDI;
  pQVar3 = d_func((QInputDialog *)0x79c936);
  in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
  (this_00->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (this_00->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (this_00->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x79c96a);
  if (pQVar3->comboBox != (QComboBox *)0x0) {
    iVar2 = QComboBox::count((QComboBox *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QList<QString>::reserve(this_01,_count);
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      QComboBox::itemText(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
      QList<QString>::append(this_00,(rvalue_ref)in_RDI);
      QString::~QString((QString *)0x79c9e2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QInputDialog::comboBoxItems() const
{
    Q_D(const QInputDialog);
    QStringList result;
    if (d->comboBox) {
        const int count = d->comboBox->count();
        result.reserve(count);
        for (int i = 0; i < count; ++i)
            result.append(d->comboBox->itemText(i));
    }
    return result;
}